

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  Mat *this_00;
  size_t sVar1;
  Layer *pLVar2;
  Option *pOVar3;
  Mat int8_weight_data;
  ParamDict pd;
  
  (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->weight_data_size,0);
  this_00 = &this->weight_data;
  Mat::operator=(this_00,(Mat *)&pd);
  Mat::~Mat((Mat *)&pd);
  if ((this_00->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->num_output,1);
      Mat::operator=(&this->bias_data,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (**mb->_vptr_ModelBin)(&pd,mb,1,1);
      this->weight_data_int8_scale = *(float *)pd._0_8_;
      Mat::~Mat((Mat *)&pd);
      (**mb->_vptr_ModelBin)(&pd,mb,1,1);
      this->bottom_blob_int8_scale = *(float *)pd._0_8_;
      Mat::~Mat((Mat *)&pd);
    }
    sVar1 = (this->weight_data).elemsize;
    if ((sVar1 == 1) && ((this->use_int8_inference & 1U) == 0)) {
      fwrite("quantized int8 weight loaded but use_int8_inference disabled\n",0x3d,1,_stderr);
      return -1;
    }
    if ((this->use_int8_inference & 1U) != 0) {
      pLVar2 = create_layer(0x39);
      this->quantize = pLVar2;
      pLVar2 = create_layer(0x3a);
      this->dequantize = pLVar2;
    }
    if (sVar1 != 4) {
      return 0;
    }
    if (this->use_int8_inference != true) {
      return 0;
    }
    if ((this->weight_data_int8_scale == 0.0) || (this->bottom_blob_int8_scale == 0.0)) {
      this->use_int8_inference = false;
      return 0;
    }
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->weight_data_int8_scale);
    (*this->quantize->_vptr_Layer[2])(this->quantize,&pd);
    int8_weight_data.dims = 0;
    int8_weight_data.w = 0;
    int8_weight_data.h = 0;
    int8_weight_data.c = 0;
    int8_weight_data.elemsize = 0;
    int8_weight_data.allocator = (Allocator *)0x0;
    int8_weight_data.data = (void *)0x0;
    int8_weight_data.refcount = (int *)0x0;
    int8_weight_data.cstep = 0;
    pLVar2 = this->quantize;
    pOVar3 = get_default_option();
    (*pLVar2->_vptr_Layer[5])(pLVar2,this_00,&int8_weight_data,pOVar3);
    if ((int8_weight_data.data != (void *)0x0) &&
       ((long)int8_weight_data.c * int8_weight_data.cstep != 0)) {
      Mat::operator=(this_00,&int8_weight_data);
      Mat::~Mat(&int8_weight_data);
      ParamDict::~ParamDict(&pd);
      return 0;
    }
    Mat::~Mat(&int8_weight_data);
    ParamDict::~ParamDict(&pd);
  }
  return -100;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        if (weight_data_int8_scale != 0.f && bottom_blob_int8_scale != 0.f)
        {
            // quantize weight to int8
            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scale);// scale

            quantize->load_param(pd);

            Mat int8_weight_data;
            quantize->forward(weight_data, int8_weight_data);

            if (int8_weight_data.empty())
                return -100;

            weight_data = int8_weight_data;
        }
        else
        {
            // plain float32 weight, fallback to float32 inference
            use_int8_inference = false;
        }
    }

    return 0;
}